

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

void pbrt::detail::
     DispatchCPU<pbrt::WavefrontPathIntegrator::GenerateRaySamples(int,int)::__0&,void,pbrt::PMJ02BNSampler,pbrt::IndependentSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler,void>
               (anon_class_16_3_0c69a62e *func,void *ptr,int index)

{
  anon_class_16_3_0c69a62e *func_00;
  uint in_EDX;
  MLTSampler *in_RSI;
  __0 *in_RDI;
  HaltonSampler *in_stack_ffffffffffffffd8;
  
  func_00 = (anon_class_16_3_0c69a62e *)(ulong)in_EDX;
  switch(func_00) {
  case (anon_class_16_3_0c69a62e *)0x0:
    WavefrontPathIntegrator::GenerateRaySamples(int,int)::$_0::operator()
              (func_00,(PMJ02BNSampler *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_16_3_0c69a62e *)0x1:
    WavefrontPathIntegrator::GenerateRaySamples(int,int)::$_0::operator()
              (func_00,(IndependentSampler *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_16_3_0c69a62e *)0x2:
    WavefrontPathIntegrator::GenerateRaySamples(int,int)::$_0::operator()
              (func_00,(StratifiedSampler *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_16_3_0c69a62e *)0x3:
    WavefrontPathIntegrator::GenerateRaySamples(int,int)::$_0::operator()
              (func_00,in_stack_ffffffffffffffd8);
    break;
  case (anon_class_16_3_0c69a62e *)0x4:
    WavefrontPathIntegrator::GenerateRaySamples(int,int)::$_0::operator()
              (func_00,(PaddedSobolSampler *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_16_3_0c69a62e *)0x5:
    WavefrontPathIntegrator::GenerateRaySamples(int,int)::$_0::operator()
              (func_00,(SobolSampler *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_16_3_0c69a62e *)0x6:
    WavefrontPathIntegrator::GenerateRaySamples(int,int)::$_0::operator()
              (func_00,(ZSobolSampler *)in_stack_ffffffffffffffd8);
    break;
  case (anon_class_16_3_0c69a62e *)0x7:
    WavefrontPathIntegrator::GenerateRaySamples(int,int)::$_0::operator()(in_RDI,in_RSI);
    break;
  default:
    DispatchCPU<pbrt::WavefrontPathIntegrator::GenerateRaySamples(int,int)::__0&,void,pbrt::DebugMLTSampler>
              (func_00,in_stack_ffffffffffffffd8,0);
  }
  return;
}

Assistant:

auto DispatchCPU(F &&func, void *ptr, int index) {
    DCHECK_GE(index, 0);

    switch (index) {
    case 0:
        return func((T0 *)ptr);
    case 1:
        return func((T1 *)ptr);
    case 2:
        return func((T2 *)ptr);
    case 3:
        return func((T3 *)ptr);
    case 4:
        return func((T4 *)ptr);
    case 5:
        return func((T5 *)ptr);
    case 6:
        return func((T6 *)ptr);
    case 7:
        return func((T7 *)ptr);
    default:
        return DispatchCPU<F, R, Ts...>(func, ptr, index - 8);
    }
}